

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O0

void VerifyMasterChain(AActor *self)

{
  AActor *local_28;
  AActor *compare;
  AActor *next;
  AActor *origin;
  AActor *self_local;
  
  if (self != (AActor *)0x0) {
    compare = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self->master);
    next = self;
    for (; local_28 = self, compare != (AActor *)0x0;
        compare = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&compare->master)) {
      while( true ) {
        if (local_28 == compare) {
          TObjPtr<AActor>::operator=(&self->master,(AActor *)0x0);
          return;
        }
        if (local_28 == next) break;
        local_28 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&local_28->master);
      }
      next = compare;
    }
  }
  return;
}

Assistant:

void VerifyMasterChain(AActor *self)
{
	// See VerifyTargetChain for detailed comments.

	if (!self) return;
	AActor *origin = self;
	AActor *next = origin->master;
	while (next) // We always care (See "VerifyTargetChain")
	{
		AActor *compare = self;
		for (;;)
		{
			if (compare == next)
			{
				self->master = NULL;
				return;
			}
			if (compare == origin) break;
			compare = compare->master;
		}

		origin = next;
		next = next->master;
	}
}